

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-error.c
# Opt level: O0

void test_bson_error_basic(void)

{
  int iVar1;
  int local_208;
  int local_204;
  bson_error_t error;
  
  bson_set_error(&local_208,0x7b,0x1c8,"%s %u","localhost",0x6989);
  iVar1 = strcmp((char *)&error,"localhost 27017");
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-error.c"
            ,0x1c,"test_bson_error_basic","!strcmp (error.message, \"localhost 27017\")");
    abort();
  }
  if (local_208 != 0x7b) {
    fprintf(_stderr,"FAIL\n\nAssert Failure: (line#%d)error.domain == 123\n",0x1d);
    abort();
  }
  if (local_204 != 0x1c8) {
    fprintf(_stderr,"FAIL\n\nAssert Failure: (line#%d)error.code == 456\n",0x1e);
    abort();
  }
  return;
}

Assistant:

static void
test_bson_error_basic (void)
{
   bson_error_t error;

   bson_set_error (&error, 123, 456, "%s %u", "localhost", 27017);
   BSON_ASSERT (!strcmp (error.message, "localhost 27017"));
   BSON_ASSERT_CMPINT (error.domain, ==, 123);
   BSON_ASSERT_CMPINT (error.code, ==, 456);
}